

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O1

el_action_t vi_zero(EditLine *el,wint_t c)

{
  wchar_t wVar1;
  el_action_t eVar2;
  int iVar3;
  
  if ((el->el_state).doingarg == L'\0') {
    (el->el_line).cursor = (el->el_line).buffer;
    if ((el->el_chared).c_vcmd.action == L'\0') {
      return '\x05';
    }
    cv_delfini(el);
    return '\x04';
  }
  iVar3 = iswdigit(c);
  eVar2 = '\x06';
  if (iVar3 != 0) {
    if ((el->el_state).doingarg == L'\0') {
      (el->el_state).argument = c + L'\xffffffd0';
      (el->el_state).doingarg = L'\x01';
    }
    else {
      wVar1 = (el->el_state).argument;
      if (L'\x000f4240' < wVar1) {
        return '\x06';
      }
      (el->el_state).argument = c + wVar1 * 10 + L'\xffffffd0';
    }
    eVar2 = '\x03';
  }
  return eVar2;
}

Assistant:

libedit_private el_action_t
vi_zero(EditLine *el, wint_t c)
{

	if (el->el_state.doingarg)
		return ed_argument_digit(el, c);

	el->el_line.cursor = el->el_line.buffer;
	if (el->el_chared.c_vcmd.action != NOP) {
		cv_delfini(el);
		return CC_REFRESH;
	}
	return CC_CURSOR;
}